

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImDrawList * __thiscall ImDrawList::CloneOutput(ImDrawList *this)

{
  int iVar1;
  int iVar2;
  ImDrawListSharedData *pIVar3;
  ImDrawCmd *pIVar4;
  unsigned_short *puVar5;
  ImDrawVert *pIVar6;
  ImDrawList *__s;
  ImDrawCmd *__dest;
  unsigned_short *__dest_00;
  ImDrawVert *__dest_01;
  int iVar7;
  
  __s = (ImDrawList *)ImGui::MemAlloc(200);
  pIVar3 = this->_Data;
  memset(__s,0,200);
  __s->_Data = pIVar3;
  pIVar4 = (__s->CmdBuffer).Data;
  if (pIVar4 != (ImDrawCmd *)0x0) {
    (__s->CmdBuffer).Size = 0;
    (__s->CmdBuffer).Capacity = 0;
    ImGui::MemFree(pIVar4);
    (__s->CmdBuffer).Data = (ImDrawCmd *)0x0;
  }
  iVar1 = (this->CmdBuffer).Size;
  iVar2 = (__s->CmdBuffer).Capacity;
  if (iVar2 < iVar1) {
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar7 <= iVar1) {
      iVar7 = iVar1;
    }
    if (iVar2 < iVar7) {
      __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar7 * 0x38);
      pIVar4 = (__s->CmdBuffer).Data;
      if (pIVar4 != (ImDrawCmd *)0x0) {
        memcpy(__dest,pIVar4,(long)(__s->CmdBuffer).Size * 0x38);
        ImGui::MemFree((__s->CmdBuffer).Data);
      }
      (__s->CmdBuffer).Data = __dest;
      (__s->CmdBuffer).Capacity = iVar7;
    }
  }
  (__s->CmdBuffer).Size = iVar1;
  memcpy((__s->CmdBuffer).Data,(this->CmdBuffer).Data,(long)iVar1 * 0x38);
  puVar5 = (__s->IdxBuffer).Data;
  if (puVar5 != (unsigned_short *)0x0) {
    (__s->IdxBuffer).Size = 0;
    (__s->IdxBuffer).Capacity = 0;
    ImGui::MemFree(puVar5);
    (__s->IdxBuffer).Data = (unsigned_short *)0x0;
  }
  iVar1 = (this->IdxBuffer).Size;
  iVar2 = (__s->IdxBuffer).Capacity;
  if (iVar2 < iVar1) {
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar7 <= iVar1) {
      iVar7 = iVar1;
    }
    if (iVar2 < iVar7) {
      __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar7 * 2);
      puVar5 = (__s->IdxBuffer).Data;
      if (puVar5 != (unsigned_short *)0x0) {
        memcpy(__dest_00,puVar5,(long)(__s->IdxBuffer).Size * 2);
        ImGui::MemFree((__s->IdxBuffer).Data);
      }
      (__s->IdxBuffer).Data = __dest_00;
      (__s->IdxBuffer).Capacity = iVar7;
    }
  }
  (__s->IdxBuffer).Size = iVar1;
  memcpy((__s->IdxBuffer).Data,(this->IdxBuffer).Data,(long)iVar1 * 2);
  pIVar6 = (__s->VtxBuffer).Data;
  if (pIVar6 != (ImDrawVert *)0x0) {
    (__s->VtxBuffer).Size = 0;
    (__s->VtxBuffer).Capacity = 0;
    ImGui::MemFree(pIVar6);
    (__s->VtxBuffer).Data = (ImDrawVert *)0x0;
  }
  iVar1 = (this->VtxBuffer).Size;
  iVar2 = (__s->VtxBuffer).Capacity;
  if (iVar2 < iVar1) {
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar7 <= iVar1) {
      iVar7 = iVar1;
    }
    if (iVar2 < iVar7) {
      __dest_01 = (ImDrawVert *)ImGui::MemAlloc((long)iVar7 * 0x14);
      pIVar6 = (__s->VtxBuffer).Data;
      if (pIVar6 != (ImDrawVert *)0x0) {
        memcpy(__dest_01,pIVar6,(long)(__s->VtxBuffer).Size * 0x14);
        ImGui::MemFree((__s->VtxBuffer).Data);
      }
      (__s->VtxBuffer).Data = __dest_01;
      (__s->VtxBuffer).Capacity = iVar7;
    }
  }
  (__s->VtxBuffer).Size = iVar1;
  memcpy((__s->VtxBuffer).Data,(this->VtxBuffer).Data,(long)iVar1 * 0x14);
  __s->Flags = this->Flags;
  return __s;
}

Assistant:

ImDrawList* ImDrawList::CloneOutput() const
{
    ImDrawList* dst = IM_NEW(ImDrawList(_Data));
    dst->CmdBuffer = CmdBuffer;
    dst->IdxBuffer = IdxBuffer;
    dst->VtxBuffer = VtxBuffer;
    dst->Flags = Flags;
    return dst;
}